

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

times * __thiscall
lest::for_test<lest::times>(lest *this,tests *specification,texts *in,times *perform,int n)

{
  bool bVar1;
  test *ptVar2;
  int iVar3;
  times *ptVar4;
  fd_set *__exceptfds;
  int iVar5;
  fd_set *__writefds;
  test *ptVar6;
  undefined4 in_register_00000084;
  string local_90 [32];
  test local_70;
  
  iVar5 = 0;
  ptVar4 = perform;
  do {
    iVar3 = (int)ptVar4;
    __exceptfds = (fd_set *)CONCAT71((int7)((ulong)ptVar4 >> 8),iVar3 <= iVar5);
    if (iVar3 != -1 && iVar3 <= iVar5) {
      return (times *)in;
    }
    ptVar2 = *(test **)(this + 8);
    for (ptVar6 = *(test **)this; ptVar6 != ptVar2; ptVar6 = ptVar6 + 1) {
      std::__cxx11::string::string(local_90,(string *)ptVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      iVar3 = select((int)local_90,(fd_set *)&stack0xffffffffffffff58,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff58);
      std::__cxx11::string::~string(local_90);
      if ((char)iVar3 != '\0') {
        test::test(&local_70,ptVar6);
        ptVar4 = times::operator()((times *)in,&local_70);
        bVar1 = (ptVar4->output).opt.abort;
        iVar3 = ptVar4->failures;
        test::~test(&local_70);
        if ((bVar1 == true) && (0 < iVar3)) {
          return (times *)in;
        }
      }
    }
    iVar5 = iVar5 + 1;
    ptVar4 = (times *)((ulong)perform & 0xffffffff);
  } while( true );
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}